

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>,std::span<slang::syntax::LocalVariableDeclarationSyntax*,18446744073709551615ul>>
          (BumpAllocator *this,
          span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL> *args)

{
  pointer ppLVar1;
  size_t sVar2;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *pSVar3;
  
  pSVar3 = (SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)this->endPtr < pSVar3 + 1) {
    pSVar3 = (SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pSVar3 + 1);
  }
  ppLVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind = SyntaxList;
  (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar3->super_SyntaxListBase).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pSVar3->super_SyntaxListBase).childCount = sVar2;
  (pSVar3->super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>).
  _M_ptr = ppLVar1;
  (pSVar3->super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>).
  _M_extent._M_extent_value = sVar2;
  (pSVar3->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006dd688;
  return pSVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }